

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O0

void is_long_long_test(void)

{
  ostream *this;
  anon_class_1_0_00000001 local_9 [8];
  anon_class_1_0_00000001 check;
  
  is_long_long_test::anon_class_1_0_00000001::operator()(local_9,"12312312",true);
  is_long_long_test::anon_class_1_0_00000001::operator()(local_9,"12312312.34",false);
  is_long_long_test::anon_class_1_0_00000001::operator()(local_9,"-12312312",true);
  is_long_long_test::anon_class_1_0_00000001::operator()(local_9,"-12312312.34",false);
  is_long_long_test::anon_class_1_0_00000001::operator()(local_9,"1e2",false);
  is_long_long_test::anon_class_1_0_00000001::operator()(local_9,"9223372036854775807",true);
  is_long_long_test::anon_class_1_0_00000001::operator()(local_9,"9223372036854775808",false);
  is_long_long_test::anon_class_1_0_00000001::operator()(local_9,"-9223372036854775808",true);
  is_long_long_test::anon_class_1_0_00000001::operator()(local_9,"-9223372036854775809",false);
  is_long_long_test::anon_class_1_0_00000001::operator()
            (local_9,"123123123123123123123123123123123123",false);
  is_long_long_test::anon_class_1_0_00000001::operator()(local_9,anon_var_dwarf_5745 + 5,false);
  is_long_long_test::anon_class_1_0_00000001::operator()(local_9,"0123",false);
  this = std::operator<<((ostream *)&std::cout,"done");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
is_long_long_test()
{
    auto check = [](char const* s, bool v) {
        if (QUtil::is_long_long(s) != v) {
            std::cout << "failed: " << s << std::endl;
        }
    };
    check("12312312", true);
    check("12312312.34", false);
    check("-12312312", true);
    check("-12312312.34", false);
    check("1e2", false);
    check("9223372036854775807", true);
    check("9223372036854775808", false);
    check("-9223372036854775808", true);
    check("-9223372036854775809", false);
    check("123123123123123123123123123123123123", false);
    check("potato", false);
    check("0123", false);
    std::cout << "done" << std::endl;
}